

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.h
# Opt level: O2

void __thiscall HEkk::~HEkk(HEkk *this)

{
  CLI::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)(this + 0x3898));
  CLI::std::
  _Vector_base<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
  ::~_Vector_base((_Vector_base<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
                   *)(this + 0x3880));
  CLI::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)(this + 0x3830));
  CLI::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)(this + 0x3818));
  CLI::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)(this + 0x3800));
  CLI::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)(this + 0x37e8));
  CLI::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)(this + 0x37d0));
  CLI::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)(this + 0x37b8));
  CLI::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)(this + 0x37a0));
  CLI::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)(this + 0x3770));
  CLI::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)(this + 0x3750));
  CLI::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)(this + 0x3730));
  CLI::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)(this + 0x3718));
  HotStart::~HotStart((HotStart *)(this + 0x3668));
  HSimplexNla::~HSimplexNla((HSimplexNla *)(this + 0x2b38));
  HighsSparseMatrix::~HighsSparseMatrix((HighsSparseMatrix *)(this + 0x2ac8));
  HighsSparseMatrix::~HighsSparseMatrix((HighsSparseMatrix *)(this + 0x2a58));
  CLI::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)(this + 0x2a38));
  CLI::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)(this + 0x2a20));
  HighsHashTable<unsigned_long,_void>::~HighsHashTable
            ((HighsHashTable<unsigned_long,_void> *)(this + 0x29f0));
  SimplexBasis::~SimplexBasis((SimplexBasis *)(this + 0x2978));
  HighsSimplexInfo::~HighsSimplexInfo((HighsSimplexInfo *)(this + 0x2560));
  std::__cxx11::string::~string((string *)(this + 0x2530));
  HighsLp::~HighsLp((HighsLp *)(this + 0x2198));
  HighsSimplexAnalysis::~HighsSimplexAnalysis((HighsSimplexAnalysis *)(this + 0x18));
  return;
}

Assistant:

HEkk()
      : callback_(nullptr),
        options_(nullptr),
        timer_(nullptr),
        lp_name_(""),
        model_status_(HighsModelStatus::kNotset),
        simplex_in_scaled_space_(false),
        cost_scale_(1.0),
        cost_perturbation_base_(0.0),
        cost_perturbation_max_abs_cost_(0.0),
        iteration_count_(0),
        dual_simplex_cleanup_level_(0),
        dual_simplex_phase1_cleanup_level_(0),
        previous_iteration_cycling_detected(-kHighsIInf),
        solve_bailout_(false),
        called_return_from_solve_(false),
        exit_algorithm_(SimplexAlgorithm::kNone),
        return_primal_solution_status_(0),
        return_dual_solution_status_(0),
        original_num_col_(0),
        original_num_row_(0),
        original_num_nz_(0),
        original_offset_(0.0),
        edge_weight_error_(0.0),
        build_synthetic_tick_(0.0),
        total_synthetic_tick_(0.0),
        debug_solve_call_num_(0),
        debug_basis_id_(0),
        time_report_(false),
        debug_initial_build_synthetic_tick_(0),
        debug_solve_report_(false),
        debug_iteration_report_(false),
        debug_basis_report_(false),
        debug_dual_feasible(false),
        debug_max_relative_dual_steepest_edge_weight_error(0) {}